

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppc.c
# Opt level: O1

void cpu_ppc_set_tb_clk(void *opaque,uint32_t freq)

{
  long lVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  long lVar4;
  ppc_tb_t *tb_env;
  
  lVar1 = *(long *)((long)opaque + 0x12f58);
  *(uint32_t *)(lVar1 + 0x18) = freq;
  *(uint32_t *)(lVar1 + 0x28) = freq;
  uVar3 = qemu_clock_get_ns(QEMU_CLOCK_VIRTUAL);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  auVar2 = ZEXT416(*(uint *)(lVar1 + 0x18)) * auVar2;
  lVar4 = __udivti3(auVar2._0_8_,auVar2._8_8_,1000000000,0);
  *(long *)(lVar1 + 0x48) = -lVar4;
  return;
}

Assistant:

static void cpu_ppc_set_tb_clk (void *opaque, uint32_t freq)
{
    CPUPPCState *env = opaque;
    PowerPCCPU *cpu = env_archcpu(env);
    ppc_tb_t *tb_env = env->tb_env;

    tb_env->tb_freq = freq;
    tb_env->decr_freq = freq;
    /* There is a bug in Linux 2.4 kernels:
     * if a decrementer exception is pending when it enables msr_ee at startup,
     * it's not ready to handle it...
     */
    _cpu_ppc_store_decr(cpu, 0xFFFFFFFF, 0xFFFFFFFF, 32);
    _cpu_ppc_store_hdecr(cpu, 0xFFFFFFFF, 0xFFFFFFFF, 32);
    cpu_ppc_store_purr(env, 0x0000000000000000ULL);
}